

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::DefaultRecyclerCollectionWrapper::DisposeObjects
          (DefaultRecyclerCollectionWrapper *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  
  if (recycler->isCollectionDisabled == true) {
    bVar2 = Recycler::IsHeapEnumInProgress(recycler);
    if ((!bVar2) || (recycler->allowAllocationDuringHeapEnum == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x37,
                         "(recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum())"
                         ,
                         "recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else {
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_28.hasException = true;
    DVar3 = ExceptionCheck::Save();
    local_28.__exceptionCheck.handledExceptionType = DVar3.handledExceptionType;
    Recycler::DisposeObjects(recycler);
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
  }
  return;
}

Assistant:

void
DefaultRecyclerCollectionWrapper::DisposeObjects(Recycler * recycler)
{
    if (IsCollectionDisabled(recycler))
    {
        return;
    }

    BEGIN_NO_EXCEPTION
    {
        recycler->DisposeObjects();
    }